

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall HModel::util_chgRowBoundsAll(HModel *this,double *XrowLower,double *XrowUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  pdVar1 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar5 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar5 = uVar4;
  }
  while( true ) {
    if (uVar5 == uVar4) {
      mlFg_Update(this,this->mlFg_action_NewBounds);
      return 0;
    }
    dVar7 = XrowLower[uVar4];
    if (1e+200 <= dVar7) break;
    dVar6 = XrowUpper[uVar4];
    if (dVar6 <= -1e+200) {
      return ~(uint)uVar4;
    }
    if (-1e+200 < dVar7) {
      dVar7 = dVar7 / pdVar1[uVar4];
    }
    pdVar2[uVar4] = dVar7;
    if (dVar6 < 1e+200) {
      dVar6 = dVar6 / pdVar1[uVar4];
    }
    pdVar3[uVar4] = dVar6;
    uVar4 = uVar4 + 1;
  }
  return (uint)uVar4 + 1;
}

Assistant:

int HModel::util_chgRowBoundsAll(const double* XrowLower, const double* XrowUpper) {
  assert(XrowLower != NULL);
  assert(XrowUpper != NULL);
  for (int row = 0; row < numRow; ++row) {
    double lower = XrowLower[row];
    double upper = XrowUpper[row];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return row+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(row+1);
    rowLower[row] = (hsol_isInfinity(-lower) ? lower : lower / rowScale[row]);
    rowUpper[row] = (hsol_isInfinity( upper) ? upper : upper / rowScale[row]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;  
}